

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerNewScopeSlots(Lowerer *this,Instr *instr,bool doStackSlots)

{
  Func *func;
  IntConstOpnd *this_00;
  Loop *pLVar1;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  OpndKind OVar5;
  uint sourceContextId;
  uint functionId;
  uint32 uVar6;
  int iVar7;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  undefined4 *puVar8;
  RegOpnd *newObjDst;
  Opnd *src;
  IndirOpnd *pIVar9;
  undefined4 extraout_var;
  AddrOpnd *opnd;
  Lowerer *pLVar10;
  LabelInstr *target;
  RegOpnd *dst;
  Lowerer *this_04;
  uint uVar11;
  undefined1 local_88 [8];
  AutoReuseOpnd autoReuseUndefinedOpnd;
  AutoReuseOpnd autoReuseCurrOpnd;
  
  func = this->m_func;
  this_02 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
  this_03 = JITTimeWorkItem::GetJITTimeInfo(func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,NewScopeSlotFastPathPhase,sourceContextId,functionId);
  if (bVar4) {
    LowerUnaryHelperMemWithFunctionInfo(this,instr,HelperOP_NewScopeSlots);
    return;
  }
  this_00 = (IntConstOpnd *)instr->m_src1;
  OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar5 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar4) goto LAB_00598d0a;
    *puVar8 = 0;
  }
  uVar6 = IR::IntConstOpnd::AsUint32(this_00);
  newObjDst = (RegOpnd *)IR::Instr::UnlinkDst(instr);
  OVar5 = IR::Opnd::GetKind((Opnd *)newObjDst);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_00598d0a;
    *puVar8 = 0;
  }
  uVar11 = uVar6 - 2;
  if (!doStackSlots) {
    GenerateRecyclerAllocAligned
              (this,HelperAllocMemForVarArray,(ulong)(uVar6 * 8) + 0xf & 0xfffffffffffffff0,
               newObjDst,instr,false);
  }
  pLVar10 = (Lowerer *)&this->m_lowererMD;
  uVar3 = 0xffff;
  if (uVar11 < 0xffff) {
    uVar3 = uVar11;
  }
  LowererMD::GenerateMemInit((LowererMD *)pLVar10,newObjDst,0,(ulong)uVar3,instr,!doStackSlots);
  src = LoadFunctionInfoOpnd(pLVar10,instr);
  pIVar9 = IR::IndirOpnd::New(newObjDst,8,src->m_type,this->m_func,false);
  InsertMove(&pIVar9->super_Opnd,src,instr,true);
  iVar7 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
  opnd = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar7),AddrOpndKindDynamicVar,instr->m_func,true,
                           (Var)0x0);
  pLVar10 = (Lowerer *)local_88;
  local_88 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)pLVar10,&opnd->super_Opnd,func,true);
  if (uVar11 < 3) {
    if (uVar6 < 3) goto LAB_00598cb7;
  }
  else {
    opnd = (AddrOpnd *)GetRegOpnd(pLVar10,&opnd->super_Opnd,instr,func,TyVar);
    if (0x10 < uVar11) {
      pLVar10 = (Lowerer *)IR::RegOpnd::New(TyUint64,func);
      autoReuseUndefinedOpnd.autoDelete = false;
      autoReuseUndefinedOpnd.wasInUse = false;
      autoReuseUndefinedOpnd._18_6_ = 0;
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)&autoReuseUndefinedOpnd.autoDelete,(Opnd *)pLVar10,this->m_func,
                 true);
      pIVar9 = IR::IndirOpnd::New(newObjDst,(uVar11 & 0xfffffff8) * 8 + -0x30,TyUint64,func,false);
      InsertLea((RegOpnd *)pLVar10,&pIVar9->super_Opnd,instr);
      if ((uVar11 & 7) != 0) {
        iVar7 = (uVar11 & 7) * 8 + 0x38;
        do {
          pIVar9 = IR::IndirOpnd::New((RegOpnd *)pLVar10,iVar7,(opnd->super_Opnd).m_type,
                                      this->m_func,false);
          InsertMove(&pIVar9->super_Opnd,(Opnd *)opnd,instr,true);
          iVar7 = iVar7 + -8;
        } while (iVar7 != 0x38);
      }
      target = InsertLoopTopLabel(this,instr);
      if ((target->field_0x78 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x2e2,"(this->m_isLoopTop)","this->m_isLoopTop");
        if (!bVar4) goto LAB_00598d0a;
        *puVar8 = 0;
      }
      pLVar1 = target->m_loop;
      iVar7 = 0x38;
      do {
        pIVar9 = IR::IndirOpnd::New((RegOpnd *)pLVar10,iVar7,(opnd->super_Opnd).m_type,this->m_func,
                                    false);
        InsertMove(&pIVar9->super_Opnd,(Opnd *)opnd,instr,true);
        iVar7 = iVar7 + -8;
      } while (iVar7 != -8);
      pIVar9 = IR::IndirOpnd::New((RegOpnd *)pLVar10,-0x40,TyUint64,func,false);
      this_04 = pLVar10;
      InsertLea((RegOpnd *)pLVar10,&pIVar9->super_Opnd,instr);
      InsertCompareBranch(this_04,(Opnd *)newObjDst,(Opnd *)pLVar10,BrLt_A,true,target,instr,false);
      BVSparse<Memory::JitArenaAllocator>::Set
                ((pLVar1->regAlloc).liveOnBackEdgeSyms,
                 *(BVIndex *)&((pLVar10->m_lowererMD).m_func)->m_threadContextInfo);
      BVSparse<Memory::JitArenaAllocator>::Set
                ((pLVar1->regAlloc).liveOnBackEdgeSyms,(newObjDst->m_sym->super_Sym).m_id);
      this_01 = (pLVar1->regAlloc).liveOnBackEdgeSyms;
      OVar5 = IR::Opnd::GetKind((Opnd *)opnd);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
LAB_00598d0a:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set(this_01,*(BVIndex *)((long)opnd->m_metadata + 0x10));
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseUndefinedOpnd.autoDelete);
      goto LAB_00598cb7;
    }
  }
  iVar7 = 0x10;
  do {
    pIVar9 = IR::IndirOpnd::New(newObjDst,iVar7,(opnd->super_Opnd).m_type,this->m_func,false);
    InsertMove(&pIVar9->super_Opnd,&opnd->super_Opnd,instr,true);
    iVar7 = iVar7 + 8;
    uVar11 = uVar11 - 1;
  } while (uVar11 != 0);
LAB_00598cb7:
  if (!doStackSlots) {
    dst = IR::RegOpnd::New(instr->m_func->m_localClosureSym,TyUint64,func);
    InsertMove(&dst->super_Opnd,(Opnd *)newObjDst,instr,true);
  }
  IR::Instr::Remove(instr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_88);
  return;
}

Assistant:

void
Lowerer::LowerNewScopeSlots(IR::Instr * instr, bool doStackSlots)
{
    Func * func = m_func;
    if (PHASE_OFF(Js::NewScopeSlotFastPathPhase, func))
    {
        this->LowerUnaryHelperMemWithFunctionInfo(instr, IR::HelperOP_NewScopeSlots);
        return;
    }

    uint const count = instr->GetSrc1()->AsIntConstOpnd()->AsUint32();
    uint const allocSize = count * sizeof(Js::Var);
    uint const actualSlotCount = count - Js::ScopeSlots::FirstSlotIndex;

    IR::RegOpnd * dst = instr->UnlinkDst()->AsRegOpnd();

    // dst = RecyclerAlloc(allocSize)
    // dst[EncodedSlotCountSlotIndex] = min(actualSlotCount, MaxEncodedSlotCount);
    // dst[ScopeMetadataSlotIndex] = FunctionBody;
    // mov undefinedOpnd, undefined
    // dst[FirstSlotIndex..count] = undefinedOpnd;

    // Note: stack allocation of both scope slots and frame display are done together
    // in lowering of NewStackFrameDisplay
    if (!doStackSlots)
    {
        GenerateRecyclerAlloc(IR::HelperAllocMemForVarArray, allocSize, dst, instr);
    }

    m_lowererMD.GenerateMemInit(dst, Js::ScopeSlots::EncodedSlotCountSlotIndex * sizeof(Js::Var),
            (size_t)min<uint>(actualSlotCount, Js::ScopeSlots::MaxEncodedSlotCount), instr, !doStackSlots);

    IR::Opnd * functionInfoOpnd = this->LoadFunctionInfoOpnd(instr);
    GenerateMemInit(dst, Js::ScopeSlots::ScopeMetadataSlotIndex * sizeof(Js::Var),
        functionInfoOpnd, instr, !doStackSlots);

    IR::Opnd * undefinedOpnd = this->LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined);
    const IR::AutoReuseOpnd autoReuseUndefinedOpnd(undefinedOpnd, func);

    // avoid using a register for the undefined pointer if we are going to assign 1 or 2

    if (actualSlotCount > 2)
    {
        undefinedOpnd = GetRegOpnd(undefinedOpnd, instr, func, TyVar);
    }

    int const loopUnrollCount = 8;

    if (actualSlotCount <= loopUnrollCount * 2)
    {
        // Just generate all the assignment in straight line code
        //  mov[dst + Js::FirstSlotIndex], undefinedOpnd
        // ...
        //  mov[dst + count - 1], undefinedOpnd
        for (unsigned int i = Js::ScopeSlots::FirstSlotIndex; i < count; i++)
        {
            GenerateMemInit(dst, sizeof(Js::Var) * i, undefinedOpnd, instr, !doStackSlots);
        }
    }
    else
    {
        // Just generate all the assignment in loop of loopUnrollCount and the rest as straight line code
        //
        //      lea currOpnd, [dst + sizeof(Var) * (loopAssignCount + Js::ScopeSlots::FirstSlotIndex - loopUnrollCount)];
        //      mov [currOpnd + loopUnrollCount + leftOverAssignCount - 1] , undefinedOpnd
        //      mov [currOpnd + loopUnrollCount + leftOverAssignCount - 2] , undefinedOpnd
        //      ...
        //      mov [currOpnd + loopUnrollCount], undefinedOpnd
        // $LoopTop:
        //      mov [currOpnd + loopUnrollCount - 1], undefinedOpnd
        //      mov [currOpnd + loopUnrollCount - 2], undefinedOpnd
        //      ...
        //      mov [currOpnd], undefinedOpnd
        //      lea currOpnd, [currOpnd - loopUnrollCount]
        //      cmp dst, currOpnd
        //      jlt $Looptop

        uint nLoop = actualSlotCount / loopUnrollCount;
        uint loopAssignCount = nLoop * loopUnrollCount;
        uint leftOverAssignCount = actualSlotCount - loopAssignCount;        // The left over assignments

        IR::RegOpnd * currOpnd = IR::RegOpnd::New(TyMachPtr, func);
        const IR::AutoReuseOpnd autoReuseCurrOpnd(currOpnd, m_func);
        InsertLea(
            currOpnd,
            IR::IndirOpnd::New(
                dst,
                sizeof(Js::Var) * (loopAssignCount + Js::ScopeSlots::FirstSlotIndex - loopUnrollCount),
                TyMachPtr,
                func),
            instr);

        for (unsigned int i = 0; i < leftOverAssignCount; i++)
        {
            GenerateMemInit(currOpnd, sizeof(Js::Var) * (loopUnrollCount + leftOverAssignCount - i - 1), undefinedOpnd, instr, !doStackSlots);
        }

        IR::LabelInstr * loopTop = InsertLoopTopLabel(instr);
        Loop * loop = loopTop->GetLoop();

        for (unsigned int i = 0; i < loopUnrollCount; i++)
        {
            GenerateMemInit(currOpnd, sizeof(Js::Var) * (loopUnrollCount - i - 1), undefinedOpnd, instr, !doStackSlots);
        }
        InsertLea(currOpnd, IR::IndirOpnd::New(currOpnd, -((int)sizeof(Js::Var) * loopUnrollCount), TyMachPtr, func), instr);

        InsertCompareBranch(dst, currOpnd, Js::OpCode::BrLt_A, true, loopTop, instr);

        loop->regAlloc.liveOnBackEdgeSyms->Set(currOpnd->m_sym->m_id);
        loop->regAlloc.liveOnBackEdgeSyms->Set(dst->m_sym->m_id);
        loop->regAlloc.liveOnBackEdgeSyms->Set(undefinedOpnd->AsRegOpnd()->m_sym->m_id);
    }

    if (!doStackSlots)
    {
        InsertMove(IR::RegOpnd::New(instr->m_func->GetLocalClosureSym(), TyMachPtr, func), dst, instr);
    }
    instr->Remove();
}